

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

UINT16 TPMS_RSA_PARMS_Marshal(TPMS_RSA_PARMS *source,BYTE **buffer,INT32 *size)

{
  UINT16 UVar1;
  UINT16 UVar2;
  UINT16 UVar3;
  UINT16 UVar4;
  UINT16 result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMS_RSA_PARMS *source_local;
  
  UVar1 = TPMT_SYM_DEF_OBJECT_Marshal(&source->symmetric,buffer,size);
  UVar2 = TPMT_RSA_SCHEME_Marshal(&source->scheme,buffer,size);
  UVar3 = UINT16_Marshal(&source->keyBits,buffer,size);
  UVar4 = UINT32_Marshal(&source->exponent,buffer,size);
  return UVar1 + UVar2 + UVar3 + UVar4;
}

Assistant:

UINT16
TPMS_RSA_PARMS_Marshal(TPMS_RSA_PARMS *source, BYTE **buffer, INT32 *size)
{
    UINT16    result = 0;
    result = (UINT16)(result + TPMT_SYM_DEF_OBJECT_Marshal((TPMT_SYM_DEF_OBJECT *)&(source->symmetric), buffer, size));
    result = (UINT16)(result + TPMT_RSA_SCHEME_Marshal((TPMT_RSA_SCHEME *)&(source->scheme), buffer, size));
    result = (UINT16)(result + TPMI_RSA_KEY_BITS_Marshal((TPMI_RSA_KEY_BITS *)&(source->keyBits), buffer, size));
    result = (UINT16)(result + UINT32_Marshal((UINT32 *)&(source->exponent), buffer, size));
    return result;
}